

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecdsa_asn1.cc
# Opt level: O2

ECDSA_SIG * ECDSA_SIG_from_bytes(uint8_t *in,size_t in_len)

{
  ECDSA_SIG *sig;
  CBS cbs;
  
  cbs.data = in;
  cbs.len = in_len;
  sig = (ECDSA_SIG *)ECDSA_SIG_parse(&cbs);
  if ((sig == (ECDSA_SIG *)0x0) || (cbs.len != 0)) {
    ERR_put_error(0x1a,0,100,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/ecdsa/ecdsa_asn1.cc"
                  ,0x105);
    ECDSA_SIG_free(sig);
    sig = (ECDSA_SIG *)0x0;
  }
  return (ECDSA_SIG *)sig;
}

Assistant:

ECDSA_SIG *ECDSA_SIG_from_bytes(const uint8_t *in, size_t in_len) {
  CBS cbs;
  CBS_init(&cbs, in, in_len);
  ECDSA_SIG *ret = ECDSA_SIG_parse(&cbs);
  if (ret == NULL || CBS_len(&cbs) != 0) {
    OPENSSL_PUT_ERROR(ECDSA, ECDSA_R_BAD_SIGNATURE);
    ECDSA_SIG_free(ret);
    return NULL;
  }
  return ret;
}